

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumStatement
          (Parser *this,EnumDescriptorProto *enum_type,LocationRecorder *enum_location,
          FileDescriptorProto *containing_file)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  EnumOptions *options;
  Rep *pRVar4;
  EnumValueDescriptorProto *enum_value;
  Arena *arena;
  LocationRecorder location;
  LocationRecorder LStack_48;
  
  bVar2 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  if (bVar2) {
    return true;
  }
  iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  if (iVar3 == 0) {
    LocationRecorder::Init(&LStack_48,enum_location,enum_location->source_code_info_);
    LocationRecorder::AddPath(&LStack_48,3);
    *(byte *)(enum_type->_has_bits_).has_bits_ = (byte)(enum_type->_has_bits_).has_bits_[0] | 2;
    options = enum_type->options_;
    if (options == (EnumOptions *)0x0) {
      arena = (Arena *)(enum_type->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
      }
      options = Arena::CreateMaybeMessage<google::protobuf::EnumOptions>(arena);
      enum_type->options_ = options;
    }
    bVar2 = ParseOption(this,&options->super_Message,&LStack_48,containing_file,OPTION_STATEMENT);
    goto LAB_00315f55;
  }
  iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  if (iVar3 == 0) {
    bVar2 = ParseReserved(this,enum_type,enum_location);
    return bVar2;
  }
  LocationRecorder::LocationRecorder
            (&LStack_48,enum_location,2,(enum_type->value_).super_RepeatedPtrFieldBase.current_size_
            );
  pRVar4 = (enum_type->value_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
    iVar3 = (enum_type->value_).super_RepeatedPtrFieldBase.total_size_;
LAB_00315f13:
    internal::RepeatedPtrFieldBase::Reserve
              (&(enum_type->value_).super_RepeatedPtrFieldBase,iVar3 + 1);
    pRVar4 = (enum_type->value_).super_RepeatedPtrFieldBase.rep_;
    iVar3 = pRVar4->allocated_size;
LAB_00315f23:
    pRVar4->allocated_size = iVar3 + 1;
    enum_value = Arena::CreateMaybeMessage<google::protobuf::EnumValueDescriptorProto>
                           ((enum_type->value_).super_RepeatedPtrFieldBase.arena_);
    pRVar4 = (enum_type->value_).super_RepeatedPtrFieldBase.rep_;
    iVar3 = (enum_type->value_).super_RepeatedPtrFieldBase.current_size_;
    (enum_type->value_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
    pRVar4->elements[iVar3] = enum_value;
  }
  else {
    iVar1 = (enum_type->value_).super_RepeatedPtrFieldBase.current_size_;
    iVar3 = pRVar4->allocated_size;
    if (iVar3 <= iVar1) {
      if (iVar3 == (enum_type->value_).super_RepeatedPtrFieldBase.total_size_) goto LAB_00315f13;
      goto LAB_00315f23;
    }
    (enum_type->value_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    enum_value = (EnumValueDescriptorProto *)pRVar4->elements[iVar1];
  }
  bVar2 = ParseEnumConstant(this,enum_value,&LStack_48,containing_file);
LAB_00315f55:
  LocationRecorder::~LocationRecorder(&LStack_48);
  return bVar2;
}

Assistant:

bool Parser::ParseEnumStatement(EnumDescriptorProto* enum_type,
                                const LocationRecorder& enum_location,
                                const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("option")) {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kOptionsFieldNumber);
    return ParseOption(enum_type->mutable_options(), location, containing_file,
                       OPTION_STATEMENT);
  } else if (LookingAt("reserved")) {
    return ParseReserved(enum_type, enum_location);
  } else {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kValueFieldNumber,
                              enum_type->value_size());
    return ParseEnumConstant(enum_type->add_value(), location, containing_file);
  }
}